

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
* capnp::compiler::NodeTranslator::compileDecl
            (Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
             *__return_storage_ptr__,uint64_t scopeId,uint scopeParameterCount,Resolver *resolver,
            ErrorReporter *errorReporter,Reader expression,Builder brandBuilder)

{
  uint *puVar1;
  _func_int **pp_Var2;
  ImplicitParams implicitMethodParams;
  undefined1 auVar3 [40];
  BrandScope *this;
  BrandScope *ptrCopy;
  undefined1 uStack_199;
  undefined4 uStack_194;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_190;
  char local_e0;
  BrandedDecl local_d8;
  
  this = (BrandScope *)operator_new(0x50);
  BrandScope::BrandScope(this,errorReporter,scopeId,scopeParameterCount,resolver);
  puVar1 = &(this->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  implicitMethodParams.params.reader._44_4_ = uStack_194;
  implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
  implicitMethodParams.params.reader._39_1_ = uStack_199;
  implicitMethodParams.params.reader.structDataSize = 0;
  implicitMethodParams.params.reader.structPointerCount = 0;
  implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
  auVar3 = ZEXT1640(ZEXT816(0));
  implicitMethodParams.scopeId = auVar3._0_8_;
  implicitMethodParams.params.reader.segment = (SegmentReader *)auVar3._8_8_;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar3._16_8_;
  implicitMethodParams.params.reader.ptr = (byte *)auVar3._24_8_;
  implicitMethodParams.params.reader.elementCount = auVar3._32_4_;
  implicitMethodParams.params.reader.step = auVar3._36_4_;
  BrandScope::compileDeclExpression(&local_190,this,expression,resolver,implicitMethodParams);
  local_e0 = local_190.ptr.isSet;
  if (local_190.ptr.isSet == true) {
    local_d8.body.tag = local_190.ptr.field_1.value.body.tag;
    if (local_190.ptr.field_1.value.body.tag == 2) {
      local_d8.body.field_1.forceAligned = (void *)local_190.ptr.field_1._8_8_;
      local_d8.body.field_1._8_8_ = local_190.ptr.field_1._16_8_;
    }
    else if (local_190.ptr.field_1.value.body.tag == 1) {
      local_d8.body.field_1._16_8_ = local_190.ptr.field_1._24_8_;
      local_d8.body.field_1._24_8_ = local_190.ptr.field_1._32_8_;
      local_d8.body.field_1.forceAligned = (void *)local_190.ptr.field_1._8_8_;
      local_d8.body.field_1._8_8_ = local_190.ptr.field_1._16_8_;
      local_d8.body.field_1.space[0x28] = local_190.ptr.field_1._48_1_;
      if (local_190.ptr.field_1._48_1_ == '\x01') {
        local_d8.body.field_1._80_8_ = local_190.ptr.field_1._88_8_;
        local_d8.body.field_1._88_8_ = local_190.ptr.field_1._96_8_;
        local_d8.body.field_1._64_8_ = local_190.ptr.field_1._72_8_;
        local_d8.body.field_1._72_8_ = local_190.ptr.field_1._80_8_;
        local_d8.body.field_1._48_8_ = local_190.ptr.field_1._56_8_;
        local_d8.body.field_1._56_8_ = local_190.ptr.field_1._64_8_;
      }
    }
    local_d8.brand.disposer = local_190.ptr.field_1.value.brand.disposer;
    local_d8.brand.ptr = local_190.ptr.field_1.value.brand.ptr;
    local_d8.source._reader.segment = local_190.ptr.field_1.value.source._reader.segment;
    local_d8.source._reader.capTable = local_190.ptr.field_1.value.source._reader.capTable;
    local_d8.source._reader.data = local_190.ptr.field_1.value.source._reader.data;
    local_d8.source._reader.pointers = local_190.ptr.field_1.value.source._reader.pointers;
    local_d8.source._reader.dataSize = local_190.ptr.field_1.value.source._reader.dataSize;
    local_d8.source._reader.pointerCount = local_190.ptr.field_1.value.source._reader.pointerCount;
    local_d8.source._reader._38_2_ = local_190.ptr.field_1._158_2_;
    local_d8.source._reader._40_8_ = local_190.ptr.field_1._160_8_;
    BrandedDecl::asResolveResult((ResolveResult *)&local_190,&local_d8,this->leafId,brandBuilder);
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.tag = local_190.ptr._0_4_;
    if (local_190.ptr._0_4_ == 2) {
      *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
           CONCAT44(local_190.ptr.field_1._4_4_,local_190.ptr.field_1.value.body.tag);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
           local_190.ptr.field_1._8_8_;
    }
    else if (local_190.ptr._0_4_ == 1) {
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
           local_190.ptr.field_1._32_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
           local_190.ptr.field_1._16_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
           local_190.ptr.field_1._24_8_;
      *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
           CONCAT44(local_190.ptr.field_1._4_4_,local_190.ptr.field_1.value.body.tag);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
           local_190.ptr.field_1._8_8_;
      *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) =
           local_190.ptr.field_1._40_1_;
      if (local_190.ptr.field_1._40_1_ == '\x01') {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
             local_190.ptr.field_1._80_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) =
             local_190.ptr.field_1._88_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) =
             local_190.ptr.field_1._64_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) =
             local_190.ptr.field_1._72_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
             CONCAT71(local_190.ptr.field_1._49_7_,local_190.ptr.field_1._48_1_);
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) =
             local_190.ptr.field_1._56_8_;
      }
    }
    if (local_190.ptr.field_1.value.brand.ptr != (BrandScope *)0x0) {
      (**(local_190.ptr.field_1.value.brand.disposer)->_vptr_Disposer)
                (local_190.ptr.field_1.value.brand.disposer,
                 ((local_190.ptr.field_1.value.brand.ptr)->super_Refcounted).super_Disposer.
                 _vptr_Disposer[-2] +
                 (long)&((local_190.ptr.field_1.value.brand.ptr)->super_Refcounted).super_Disposer.
                        _vptr_Disposer);
    }
  }
  else {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  pp_Var2 = (this->super_Refcounted).super_Disposer._vptr_Disposer;
  (**pp_Var2)(this,pp_Var2[-2] + (long)&(this->super_Refcounted).super_Disposer._vptr_Disposer);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::Resolver::ResolveResult> NodeTranslator::compileDecl(
    uint64_t scopeId, uint scopeParameterCount, Resolver& resolver, ErrorReporter& errorReporter,
    Expression::Reader expression, schema::Brand::Builder brandBuilder) {
  auto scope = kj::refcounted<BrandScope>(errorReporter, scopeId, scopeParameterCount, resolver);
  KJ_IF_MAYBE(decl, scope->compileDeclExpression(expression, resolver, noImplicitParams())) {
    return decl->asResolveResult(scope->getScopeId(), brandBuilder);
  } else {
    return nullptr;
  }
}